

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.h
# Opt level: O2

void __thiscall
cppcms::impl::
event_handler_binder_p1<void_(cppcms::impl::cgi::http::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::http>,_booster::callback<void_(const_std::error_code_&)>_>
::event_handler_binder_p1
          (event_handler_binder_p1<void_(cppcms::impl::cgi::http::*)(const_std::error_code_&,_const_booster::callback<void_(const_std::error_code_&)>_&),_std::shared_ptr<cppcms::impl::cgi::http>,_booster::callback<void_(const_std::error_code_&)>_>
           *this,offset_in_http_to_subr *f,shared_ptr<cppcms::impl::cgi::http> *s,
          callback<void_(const_std::error_code_&)> *p1)

{
  offset_in_http_to_subr oVar1;
  
  booster::callable<void_(const_std::error_code_&)>::callable(&this->super_callable_type);
  (this->super_callable_type).super_refcounted._vptr_refcounted =
       (_func_int **)&PTR__event_handler_binder_p1_002b8ea8;
  oVar1 = f[1];
  this->f_ = *f;
  *(offset_in_http_to_subr *)&this->field_0x18 = oVar1;
  std::__shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&(this->s_).super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>,
             &s->super___shared_ptr<cppcms::impl::cgi::http,_(__gnu_cxx::_Lock_policy)2>);
  booster::intrusive_ptr<booster::callable<void_(const_std::error_code_&)>_>::intrusive_ptr
            (&(this->p1_).call_ptr,&p1->call_ptr);
  return;
}

Assistant:

event_handler_binder_p1(F const &f,S const &s, P1 const &p1) : f_(f), s_(s), p1_(p1) {}